

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O1

ostream * tchecker::graph::dot_output_attributes
                    (ostream *os,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *attr)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  for (p_Var2 = (attr->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(attr->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (p_Var2 != (attr->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    }
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,*(char **)(p_Var2 + 2),(long)p_Var2[2]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

static std::ostream & dot_output_attributes(std::ostream & os, std::map<std::string, std::string> const & attr)
{
  os << "[";
  for (auto it = attr.begin(); it != attr.end(); ++it) {
    if (it != attr.begin())
      os << ", ";
    auto && [key, value] = *it;
    os << key << "=\"" << value << "\"";
  }
  os << "]";
  return os;
}